

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

error<idx2::err_code> idx2::ReadMetaData(cstr FileName,metadata *Meta)

{
  long lVar1;
  bool bVar2;
  dtype dVar3;
  int iVar4;
  anon_union_8_2_2df48d06_for_stref_0 aVar5;
  uint uVar6;
  v3i *Result;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar10;
  stref sVar11;
  error<idx2::err_code> eVar12;
  undefined4 uVar13;
  anon_union_8_2_2df48d06_for_stref_0 local_118;
  int local_110;
  stref NameStr;
  anon_union_8_2_2df48d06_for_stref_0 local_e0;
  int iStack_d8;
  undefined4 uStack_d4;
  anon_union_8_2_2df48d06_for_stref_0 local_d0;
  int local_c8;
  cstr local_c0;
  v3i *local_b8;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_DataSet_cpp:83:3)>
  __ScopeGuard__0;
  anon_union_8_2_2df48d06_for_stref_0 local_a0;
  int local_98;
  char *local_90;
  undefined4 local_88;
  undefined4 local_80;
  buffer local_78;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  undefined4 local_38;
  
  if ((Mallocator()::Instance == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Mallocator()::Instance), iVar4 != 0)) {
    __cxa_guard_release(&Mallocator()::Instance);
  }
  local_78.Data = (byte *)0x0;
  local_78.Bytes = 0;
  local_78.Alloc = (allocator *)&Mallocator()::Instance;
  eVar10 = ReadFile(FileName,&local_78);
  if (eVar10.Code == NoError) {
    __ScopeGuard__0.Dismissed = false;
    local_58.Ptr = (str)local_78.Data;
    local_50 = (undefined4)local_78.Bytes;
    local_48 = "\r\n";
    local_40 = 2;
    local_38 = 0;
    local_c0 = FileName;
    __ScopeGuard__0.Func.Buf = &local_78;
    sVar11 = Next((tokenizer *)&local_58);
    Result = &Meta->Dims3;
    while (sVar11.field_0.Ptr != (str)0x0) {
      local_98 = sVar11.Size;
      local_90 = "=";
      local_88 = 1;
      local_80 = 0;
      local_a0 = sVar11.field_0;
      sVar11 = Next((tokenizer *)&local_a0);
      NameStr.field_0 = sVar11.field_0;
      NameStr.Size = sVar11.Size;
      sVar11 = Trim(&NameStr);
      local_d0 = sVar11.field_0;
      local_c8 = sVar11.Size;
      sVar11 = Next((tokenizer *)&local_a0);
      NameStr.field_0 = sVar11.field_0;
      NameStr.Size = sVar11.Size;
      sVar11 = Trim(&NameStr);
      local_e0 = sVar11.field_0;
      iStack_d8 = sVar11.Size;
      if ((local_d0.Ptr == (str)0x0) || (local_e0.Ptr == (str)0x0)) {
        *(char **)(*in_FS_OFFSET + -0x400) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x5c;
        sVar11 = ToString(ParseFailed);
        aVar5 = sVar11.field_0;
        uVar6 = sVar11.Size;
        uVar7 = 0x10000000011;
        uVar13 = 0x5c;
        goto LAB_00108af7;
      }
      NameStr.field_0.Ptr = "name";
      NameStr.Size = 4;
      bVar2 = operator==((stref *)&local_d0,&NameStr);
      if (bVar2) {
        NameStr.Size = 0x3f;
        NameStr.field_0 = (anon_union_8_2_2df48d06_for_stref_0)Meta;
        sVar11 = Trim((stref *)&local_e0);
        local_118 = sVar11.field_0;
        local_110 = sVar11.Size;
        Copy((stref *)&local_118,&NameStr,true);
      }
      else {
        NameStr.field_0.Ptr = "field";
        NameStr.Size = 5;
        bVar2 = operator==((stref *)&local_d0,&NameStr);
        if (bVar2) {
          NameStr.Size = 0x3f;
          NameStr.field_0 = (anon_union_8_2_2df48d06_for_stref_0)Meta->Field;
          sVar11 = Trim((stref *)&local_e0);
          local_118 = sVar11.field_0;
          local_110 = sVar11.Size;
          Copy((stref *)&local_118,&NameStr,true);
        }
        else {
          NameStr.field_0.Ptr = "dimensions";
          NameStr.Size = 10;
          bVar2 = operator==((stref *)&local_d0,&NameStr);
          if (!bVar2) {
            NameStr.field_0.Ptr = "type";
            NameStr.Size = 4;
            bVar2 = operator==((stref *)&local_d0,&NameStr);
            if (bVar2) {
              sVar11.Size = iStack_d8;
              sVar11.field_0.Ptr = local_e0.Ptr;
              sVar11._12_4_ = 0;
              dVar3 = StringTo<idx2::dtype>::operator()((StringTo<idx2::dtype> *)&NameStr,sVar11);
              Meta->DType = dVar3;
              if (dVar3 != __Invalid__) goto LAB_001089f8;
              *(char **)(*in_FS_OFFSET + -0x400) =
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x7b;
              sVar11 = ToString(TypeNotSupported);
              aVar5 = sVar11.field_0;
              uVar6 = sVar11.Size;
              uVar7 = 0x10000000009;
              uVar13 = 0x7b;
            }
            else {
              *(char **)(*in_FS_OFFSET + -0x400) =
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x7f;
              sVar11 = ToString(AttributeNotFound);
              aVar5 = sVar11.field_0;
              uVar6 = sVar11.Size;
              uVar7 = 0x10000000007;
              uVar13 = 0x7f;
            }
LAB_00108af7:
            lVar1 = *in_FS_OFFSET;
LAB_00108b10:
            iVar4 = snprintf((char *)(lVar1 + -0xf80),0x400,"%.*s (file %s, line %d): ",(ulong)uVar6
                             ,aVar5.Ptr,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                             ,uVar13);
            pcVar9 = "File %s";
            snprintf((char *)(lVar1 + -0xf80) + iVar4,0x400 - (long)iVar4,"File %s",local_c0);
            goto LAB_00108b5c;
          }
          NameStr._12_4_ = uStack_d4;
          NameStr.Size = iStack_d8;
          NameStr.field_0.Ptr = local_e0.Ptr;
          sVar11 = Next((tokenizer *)&NameStr);
          local_110 = sVar11.Size;
          uVar8 = 0;
          local_118 = sVar11.field_0;
          local_b8 = Result;
          while (local_118.Ptr != (str)0x0) {
            if (uVar8 == 3) {
              __assert_fail("Idx < 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
            }
            bVar2 = ToInt((stref *)&local_118,(int *)Result);
            if (!bVar2) {
              *(char **)(*in_FS_OFFSET + -0x400) =
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x6f;
              sVar11 = ToString(ParseFailed);
              aVar5 = sVar11.field_0;
              uVar6 = sVar11.Size;
              uVar7 = 0x10000000011;
              lVar1 = *in_FS_OFFSET;
              uVar13 = 0x6f;
              goto LAB_00108b10;
            }
            sVar11 = Next((tokenizer *)&NameStr);
            local_110 = sVar11.Size;
            uVar8 = uVar8 + 1;
            Result = (v3i *)&(Result->field_0).field_0.Y;
            local_118 = sVar11.field_0;
          }
          Result = local_b8;
          if ((uVar8 != 3) && ((Meta->Dims3).field_0.field_0.Z = 1, uVar8 < 2)) {
            (Meta->Dims3).field_0.field_0.Y = 1;
          }
        }
      }
LAB_001089f8:
      sVar11 = Next((tokenizer *)&local_58);
    }
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x82;
    pcVar9 = "";
    uVar7 = 0;
LAB_00108b5c:
    eVar10.Code = (int)uVar7;
    eVar10.StackIdx = (char)((ulong)uVar7 >> 0x20);
    eVar10.StrGened = (bool)(char)((ulong)uVar7 >> 0x28);
    eVar10._14_2_ = (short)((ulong)uVar7 >> 0x30);
    eVar10.Msg = pcVar9;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp:83:3)>
    ::~scope_guard(&__ScopeGuard__0);
  }
  eVar12._8_8_ = eVar10._8_8_ & 0xffffffffffff;
  eVar12.Msg = eVar10.Msg;
  return eVar12;
}

Assistant:

error<>
ReadMetaData(cstr FileName, metadata* Meta)
{
  buffer Buf;
  error Ok = ReadFile(FileName, &Buf);
  if (Ok.Code != err_code::NoError)
    return Ok;
  idx2_CleanUp(0, DeallocBuf(&Buf));
  stref Str((cstr)Buf.Data, (int)Buf.Bytes);
  tokenizer TkLine(Str, "\r\n");
  for (stref Line = Next(&TkLine); Line; Line = Next(&TkLine))
  {
    tokenizer TkEq(Line, "=");
    stref Attr = Trim(Next(&TkEq));
    stref Value = Trim(Next(&TkEq));
    if (!Attr || !Value)
      return idx2_Error(err_code::ParseFailed, "File %s", FileName);

    if (Attr == "name")
    {
      stref NameStr = idx2_StRef(Meta->Name);
      Copy(Trim(Value), &NameStr);
    }
    else if (Attr == "field")
    {
      stref FieldStr = idx2_StRef(Meta->Field);
      Copy(Trim(Value), &FieldStr);
    }
    else if (Attr == "dimensions")
    {
      tokenizer TkSpace(Value, " ");
      int D = 0;
      for (stref Dim = Next(&TkSpace); Dim && D < 4; Dim = Next(&TkSpace), ++D)
      {
        if (!ToInt(Dim, &Meta->Dims3[D]))
          return idx2_Error(err_code::ParseFailed, "File %s", FileName);
      }
      if (D >= 4)
        return idx2_Error(err_code::DimensionsTooMany, "File %s", FileName);
      if (D <= 2)
        Meta->Dims3[2] = 1;
      if (D <= 1)
        Meta->Dims3[1] = 1;
    }
    else if (Attr == "type")
    {
      if ((Meta->DType = StringTo<dtype>()(Value)) == dtype::__Invalid__)
        return idx2_Error(err_code::TypeNotSupported, "File %s", FileName);
    }
    else
    {
      return idx2_Error(err_code::AttributeNotFound, "File %s", FileName);
    }
  }
  return idx2_Error(err_code::NoError);
}